

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O2

bool __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::evaluate
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,
          QExpression *left,QExpression **expr,QOperation previous_oper)

{
  QOperation operation;
  bool bVar1;
  QExpression *pQVar2;
  QExpression *next_expr;
  QExpression right;
  QExpression *local_50;
  anon_union_16_3_21f97482_for_QExpression_0 local_48;
  undefined2 local_38;
  
  local_38 = 0;
  local_48.SubExpressions.storage_ = (QExpression *)0x0;
  local_48._8_8_ = 0;
  bVar1 = GetExpressionValue(this,left,*expr,(*expr)->Operation);
  if (bVar1) {
    pQVar2 = *expr;
    do {
      while( true ) {
        operation = pQVar2->Operation;
        if (operation == NoOp) {
          bVar1 = left->Type != NotANumber;
          goto LAB_00112fa8;
        }
        local_50 = pQVar2 + 1;
        if (pQVar2[1].Operation <= operation) break;
        bVar1 = evaluate(this,(QExpression *)&local_48.SubExpressions,&local_50,operation);
        if (!bVar1) goto LAB_00112fa6;
        bVar1 = evaluateExpression(this,left,(QExpression *)&local_48.SubExpressions,
                                   (*expr)->Operation);
        if (!bVar1) goto LAB_00112fa6;
        *expr = local_50;
        pQVar2 = local_50;
      }
      bVar1 = GetExpressionValue(this,(QExpression *)&local_48.SubExpressions,local_50,operation);
      if (!bVar1) goto LAB_00112fa6;
      bVar1 = evaluateExpression(this,left,(QExpression *)&local_48.SubExpressions,
                                 (*expr)->Operation);
      if (!bVar1) goto LAB_00112fa6;
      *expr = local_50;
      pQVar2 = local_50;
    } while (previous_oper < local_50->Operation);
    bVar1 = true;
  }
  else {
LAB_00112fa6:
    bVar1 = false;
  }
LAB_00112fa8:
  QExpression::~QExpression((QExpression *)&local_48.SubExpressions);
  return bVar1;
}

Assistant:

bool evaluate(QExpression &left, const QExpression *&expr, const QOperation previous_oper) const noexcept {
        const QExpression *next_expr;
        QExpression        right;

        if (GetExpressionValue(left, expr, expr->Operation)) {
            while (expr->Operation != QOperation::NoOp) {
                next_expr = (expr + 1U);

                if (expr->Operation >= next_expr->Operation) {
                    if (GetExpressionValue(right, next_expr, expr->Operation) &&
                        evaluateExpression(left, right, expr->Operation)) {
                        expr = next_expr;

                        if (previous_oper < expr->Operation) {
                            continue;
                        }

                        return true;
                    }
                } else if (evaluate(right, next_expr, expr->Operation) &&
                           evaluateExpression(left, right, expr->Operation)) {
                    expr = next_expr;
                    continue;
                }

                return false;
            }

            return (left.Type != ExpressionType::NotANumber);
        }

        return false;
    }